

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plugins.c
# Opt level: O0

LY_ERR plugins_insert(ly_ctx *ctx,LYPLG type,void *recs)

{
  LY_ERR LVar1;
  ly_set *local_60;
  ly_set *local_58;
  uint local_4c;
  LY_ERR ret___1;
  uint32_t i_1;
  lyplg_type_record *rec_1;
  LY_ERR ret__;
  uint32_t i;
  lyplg_ext_record *rec;
  ly_set *plugins;
  void *recs_local;
  LYPLG type_local;
  ly_ctx *ctx_local;
  
  if (recs != (void *)0x0) {
    if (type == LYPLG_EXTENSION) {
      if (ctx == (ly_ctx *)0x0) {
        local_58 = &plugins_extensions;
      }
      else {
        local_58 = &ctx->plugins_extensions;
      }
      rec_1._4_4_ = 0;
      while (*(long *)((long)recs + (ulong)rec_1._4_4_ * 0x70 + 0x10) != 0) {
        LVar1 = ly_set_add(local_58,(void *)((long)recs + (ulong)rec_1._4_4_ * 0x70),'\0',
                           (uint32_t *)0x0);
        if (LVar1 != LY_SUCCESS) {
          return LVar1;
        }
        rec_1._4_4_ = rec_1._4_4_ + 1;
      }
    }
    else {
      if (ctx == (ly_ctx *)0x0) {
        local_60 = &plugins_types;
      }
      else {
        local_60 = &ctx->plugins_types;
      }
      local_4c = 0;
      while (*(long *)((long)recs + (ulong)local_4c * 0x60 + 0x10) != 0) {
        LVar1 = ly_set_add(local_60,(void *)((long)recs + (ulong)local_4c * 0x60),'\0',
                           (uint32_t *)0x0);
        if (LVar1 != LY_SUCCESS) {
          return LVar1;
        }
        local_4c = local_4c + 1;
      }
    }
  }
  return LY_SUCCESS;
}

Assistant:

static LY_ERR
plugins_insert(struct ly_ctx *ctx, enum LYPLG type, const void *recs)
{
    struct ly_set *plugins;

    if (!recs) {
        return LY_SUCCESS;
    }

    if (type == LYPLG_EXTENSION) {
        const struct lyplg_ext_record *rec = (const struct lyplg_ext_record *)recs;

        plugins = ctx ? &ctx->plugins_extensions : &plugins_extensions;

        for (uint32_t i = 0; rec[i].name; i++) {
            LY_CHECK_RET(ly_set_add(plugins, (void *)&rec[i], 0, NULL));
        }
    } else { /* LYPLG_TYPE */
        const struct lyplg_type_record *rec = (const struct lyplg_type_record *)recs;

        plugins = ctx ? &ctx->plugins_types : &plugins_types;

        for (uint32_t i = 0; rec[i].name; i++) {
            LY_CHECK_RET(ly_set_add(plugins, (void *)&rec[i], 0, NULL));
        }
    }

    return LY_SUCCESS;
}